

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  AABBNodeMB4D *node1;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar52;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar72 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar73 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar74;
  float fVar87;
  float fVar88;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar89;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar90;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar99;
  float fVar100;
  undefined1 auVar96 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  float fVar114;
  float fVar116;
  uint uVar117;
  float fVar118;
  uint uVar119;
  float fVar120;
  uint uVar121;
  undefined1 auVar115 [64];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [64];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float fStack_14fc;
  int local_14dc;
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [8];
  float fStack_14b0;
  float fStack_14ac;
  undefined1 local_14a8 [16];
  long local_1490;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  Scene *local_1478;
  ulong local_1470;
  long local_1468;
  ulong local_1460;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  undefined4 local_144c;
  float local_1448;
  undefined4 local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  RTCFilterFunctionNArguments local_1428;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [8];
  float fStack_13e0;
  float fStack_13dc;
  undefined1 local_13d8 [8];
  float fStack_13d0;
  float fStack_13cc;
  undefined1 local_13c8 [8];
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar52 = ray->tfar;
    auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar52) {
      local_1520 = local_11d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar5,auVar91);
      auVar101._8_4_ = 0x219392ef;
      auVar101._0_8_ = 0x219392ef219392ef;
      auVar101._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar101,1);
      auVar91 = vblendvps_avx((undefined1  [16])aVar5,auVar101,auVar91);
      auVar101 = vrcpps_avx(auVar91);
      fVar58 = auVar101._0_4_;
      auVar75._0_4_ = fVar58 * auVar91._0_4_;
      fVar59 = auVar101._4_4_;
      auVar75._4_4_ = fVar59 * auVar91._4_4_;
      fVar60 = auVar101._8_4_;
      auVar75._8_4_ = fVar60 * auVar91._8_4_;
      fVar99 = auVar101._12_4_;
      auVar75._12_4_ = fVar99 * auVar91._12_4_;
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar91 = vsubps_avx(auVar102,auVar75);
      auVar76._0_4_ = fVar58 + fVar58 * auVar91._0_4_;
      auVar76._4_4_ = fVar59 + fVar59 * auVar91._4_4_;
      auVar76._8_4_ = fVar60 + fVar60 * auVar91._8_4_;
      auVar76._12_4_ = fVar99 + fVar99 * auVar91._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar110 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar111 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar113 = ZEXT3264(local_1238);
      auVar91 = vshufps_avx(auVar76,auVar76,0);
      local_1258._16_16_ = auVar91;
      local_1258._0_16_ = auVar91;
      auVar115 = ZEXT3264(local_1258);
      auVar91 = vmovshdup_avx(auVar76);
      auVar96 = ZEXT1664(auVar91);
      auVar101 = vshufps_avx(auVar76,auVar76,0x55);
      local_1278._16_16_ = auVar101;
      local_1278._0_16_ = auVar101;
      auVar123 = ZEXT3264(local_1278);
      auVar101 = vshufpd_avx(auVar76,auVar76,1);
      auVar106 = ZEXT1664(auVar101);
      auVar75 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar86 = ZEXT1664(auVar75);
      local_1298._16_16_ = auVar75;
      local_1298._0_16_ = auVar75;
      auVar128 = ZEXT3264(local_1298);
      uVar39 = (ulong)(auVar76._0_4_ < 0.0) << 5;
      uVar51 = (ulong)(auVar91._0_4_ < 0.0) << 5 | 0x40;
      uVar40 = (ulong)(auVar101._0_4_ < 0.0) << 5 | 0x80;
      uVar50 = uVar39 ^ 0x20;
      auVar91 = vshufps_avx(auVar61,auVar61,0);
      auVar73 = ZEXT1664(auVar91);
      local_12b8._16_16_ = auVar91;
      local_12b8._0_16_ = auVar91;
      auVar130 = ZEXT3264(local_12b8);
      auVar91 = vshufps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),0);
      local_12d8._16_16_ = auVar91;
      local_12d8._0_16_ = auVar91;
      auVar131 = ZEXT3264(local_12d8);
      local_13f8 = mm_lookupmask_ps._240_8_;
      uStack_13f0 = mm_lookupmask_ps._248_8_;
      local_1470 = uVar39;
LAB_00e5ea5f:
      if (local_1520 != local_11d8) {
        uVar49 = local_1520[-1];
        local_1520 = local_1520 + -1;
        do {
          fVar52 = (ray->dir).field_0.m128[3];
          auVar57._4_4_ = fVar52;
          auVar57._0_4_ = fVar52;
          auVar57._8_4_ = fVar52;
          auVar57._12_4_ = fVar52;
          auVar57._16_4_ = fVar52;
          auVar57._20_4_ = fVar52;
          auVar57._24_4_ = fVar52;
          auVar57._28_4_ = fVar52;
          do {
            if ((uVar49 & 8) != 0) {
              local_1468 = (ulong)((uint)uVar49 & 0xf) - 8;
              uVar49 = uVar49 & 0xfffffffffffffff0;
              local_1490 = 0;
              goto LAB_00e5ec2e;
            }
            uVar35 = uVar49 & 0xfffffffffffffff0;
            pfVar3 = (float *)(uVar35 + 0x100 + uVar39);
            pfVar1 = (float *)(uVar35 + 0x40 + uVar39);
            auVar72._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar72._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar72._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar72._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar72._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar72._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar72._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar72._28_4_ = auVar73._28_4_ + pfVar1[7];
            auVar72 = vsubps_avx(auVar72,auVar110._0_32_);
            auVar24._4_4_ = auVar115._4_4_ * auVar72._4_4_;
            auVar24._0_4_ = auVar115._0_4_ * auVar72._0_4_;
            auVar24._8_4_ = auVar115._8_4_ * auVar72._8_4_;
            auVar24._12_4_ = auVar115._12_4_ * auVar72._12_4_;
            auVar24._16_4_ = auVar115._16_4_ * auVar72._16_4_;
            auVar24._20_4_ = auVar115._20_4_ * auVar72._20_4_;
            auVar24._24_4_ = auVar115._24_4_ * auVar72._24_4_;
            auVar24._28_4_ = auVar72._28_4_;
            auVar72 = vmaxps_avx(auVar130._0_32_,auVar24);
            pfVar3 = (float *)(uVar35 + 0x100 + uVar51);
            pfVar1 = (float *)(uVar35 + 0x40 + uVar51);
            auVar84._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar84._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar84._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar84._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar84._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar84._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar84._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar84._28_4_ = auVar86._28_4_ + pfVar1[7];
            auVar24 = vsubps_avx(auVar84,auVar111._0_32_);
            auVar8._4_4_ = auVar123._4_4_ * auVar24._4_4_;
            auVar8._0_4_ = auVar123._0_4_ * auVar24._0_4_;
            auVar8._8_4_ = auVar123._8_4_ * auVar24._8_4_;
            auVar8._12_4_ = auVar123._12_4_ * auVar24._12_4_;
            auVar8._16_4_ = auVar123._16_4_ * auVar24._16_4_;
            auVar8._20_4_ = auVar123._20_4_ * auVar24._20_4_;
            auVar8._24_4_ = auVar123._24_4_ * auVar24._24_4_;
            auVar8._28_4_ = auVar24._28_4_;
            pfVar3 = (float *)(uVar35 + 0x100 + uVar40);
            pfVar1 = (float *)(uVar35 + 0x40 + uVar40);
            auVar94._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar94._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar94._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar94._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar94._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar94._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar94._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar94._28_4_ = auVar96._28_4_ + pfVar1[7];
            auVar25 = vsubps_avx(auVar94,auVar113._0_32_);
            auVar27._4_4_ = auVar128._4_4_ * auVar25._4_4_;
            auVar27._0_4_ = auVar128._0_4_ * auVar25._0_4_;
            auVar27._8_4_ = auVar128._8_4_ * auVar25._8_4_;
            auVar27._12_4_ = auVar128._12_4_ * auVar25._12_4_;
            auVar27._16_4_ = auVar128._16_4_ * auVar25._16_4_;
            auVar27._20_4_ = auVar128._20_4_ * auVar25._20_4_;
            auVar27._24_4_ = auVar128._24_4_ * auVar25._24_4_;
            auVar27._28_4_ = auVar25._28_4_;
            auVar24 = vmaxps_avx(auVar8,auVar27);
            auVar72 = vmaxps_avx(auVar72,auVar24);
            pfVar3 = (float *)(uVar35 + 0x100 + uVar50);
            pfVar1 = (float *)(uVar35 + 0x40 + uVar50);
            auVar85._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar85._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar85._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar85._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar85._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar85._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar85._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar85._28_4_ = auVar24._28_4_ + pfVar1[7];
            auVar24 = vsubps_avx(auVar85,auVar110._0_32_);
            auVar28._4_4_ = auVar115._4_4_ * auVar24._4_4_;
            auVar28._0_4_ = auVar115._0_4_ * auVar24._0_4_;
            auVar28._8_4_ = auVar115._8_4_ * auVar24._8_4_;
            auVar28._12_4_ = auVar115._12_4_ * auVar24._12_4_;
            auVar28._16_4_ = auVar115._16_4_ * auVar24._16_4_;
            auVar28._20_4_ = auVar115._20_4_ * auVar24._20_4_;
            auVar28._24_4_ = auVar115._24_4_ * auVar24._24_4_;
            auVar28._28_4_ = auVar24._28_4_;
            pfVar3 = (float *)(uVar35 + 0x100 + (uVar51 ^ 0x20));
            auVar8 = vminps_avx(auVar131._0_32_,auVar28);
            pfVar1 = (float *)(uVar35 + 0x40 + (uVar51 ^ 0x20));
            auVar95._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar95._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar95._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar95._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar95._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar95._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar95._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar95._28_4_ = auVar25._28_4_ + pfVar1[7];
            auVar24 = vsubps_avx(auVar95,auVar111._0_32_);
            pfVar3 = (float *)(uVar35 + 0x100 + (uVar40 ^ 0x20));
            pfVar1 = (float *)(uVar35 + 0x40 + (uVar40 ^ 0x20));
            auVar105._0_4_ = fVar52 * *pfVar3 + *pfVar1;
            auVar105._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
            auVar105._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
            auVar105._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
            auVar105._16_4_ = fVar52 * pfVar3[4] + pfVar1[4];
            auVar105._20_4_ = fVar52 * pfVar3[5] + pfVar1[5];
            auVar105._24_4_ = fVar52 * pfVar3[6] + pfVar1[6];
            auVar105._28_4_ = auVar106._28_4_ + pfVar1[7];
            auVar25._4_4_ = auVar123._4_4_ * auVar24._4_4_;
            auVar25._0_4_ = auVar123._0_4_ * auVar24._0_4_;
            auVar25._8_4_ = auVar123._8_4_ * auVar24._8_4_;
            auVar25._12_4_ = auVar123._12_4_ * auVar24._12_4_;
            auVar25._16_4_ = auVar123._16_4_ * auVar24._16_4_;
            auVar25._20_4_ = auVar123._20_4_ * auVar24._20_4_;
            auVar25._24_4_ = auVar123._24_4_ * auVar24._24_4_;
            auVar25._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar105,auVar113._0_32_);
            auVar29._4_4_ = auVar128._4_4_ * auVar24._4_4_;
            auVar29._0_4_ = auVar128._0_4_ * auVar24._0_4_;
            auVar29._8_4_ = auVar128._8_4_ * auVar24._8_4_;
            auVar29._12_4_ = auVar128._12_4_ * auVar24._12_4_;
            auVar29._16_4_ = auVar128._16_4_ * auVar24._16_4_;
            auVar29._20_4_ = auVar128._20_4_ * auVar24._20_4_;
            auVar29._24_4_ = auVar128._24_4_ * auVar24._24_4_;
            auVar29._28_4_ = auVar24._28_4_;
            auVar106 = ZEXT3264(auVar29);
            auVar24 = vminps_avx(auVar25,auVar29);
            auVar8 = vminps_avx(auVar8,auVar24);
            auVar72 = vcmpps_avx(auVar72,auVar8,2);
            if (((uint)uVar49 & 7) == 6) {
              auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar35 + 0x1c0),auVar57,2);
              auVar24 = vcmpps_avx(auVar57,*(undefined1 (*) [32])(uVar35 + 0x1e0),1);
              auVar8 = vandps_avx(auVar8,auVar24);
              auVar72 = vandps_avx(auVar8,auVar72);
            }
            auVar96 = ZEXT3264(auVar24);
            auVar91 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
            auVar61 = vpsllw_avx(auVar91,0xf);
            auVar73 = ZEXT1664(auVar61);
            auVar91 = vpacksswb_avx(auVar61,auVar61);
            auVar86 = ZEXT1664(auVar91);
            bVar26 = SUB161(auVar91 >> 7,0) & 1 | (SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar91 >> 0x17,0) & 1) << 2 | (SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar91 >> 0x27,0) & 1) << 4 | (SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar91 >> 0x37,0) & 1) << 6 | SUB161(auVar91 >> 0x3f,0) << 7;
            if ((((((((auVar61 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar61 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar61 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar61 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar61[0xf]) goto LAB_00e5ea5f;
            lVar7 = 0;
            if (bVar26 != 0) {
              for (; (bVar26 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar49 = *(ulong *)(uVar35 + lVar7 * 8);
            uVar36 = bVar26 - 1 & (uint)bVar26;
            uVar37 = (ulong)uVar36;
          } while (uVar36 == 0);
          do {
            *local_1520 = uVar49;
            local_1520 = local_1520 + 1;
            lVar7 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar49 = *(ulong *)(uVar35 + lVar7 * 8);
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00e5ec2e:
  if (local_1490 == local_1468) goto LAB_00e5ea5f;
  lVar41 = local_1490 * 0x50;
  local_1478 = context->scene;
  pGVar6 = (context->scene->geometries).items[*(uint *)(uVar49 + 0x30 + lVar41)].ptr;
  fVar52 = (pGVar6->time_range).lower;
  fVar52 = pGVar6->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar52) / ((pGVar6->time_range).upper - fVar52));
  auVar91 = vroundss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),9);
  auVar91 = vminss_avx(auVar91,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar64 = vmaxss_avx(auVar108._0_16_,auVar91);
  lVar38 = (long)(int)auVar64._0_4_ * 0x38;
  uVar46 = (ulong)*(uint *)(uVar49 + 4 + lVar41);
  lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar38);
  lVar38 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar38);
  auVar91 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar49 + lVar41) * 4);
  uVar44 = (ulong)*(uint *)(uVar49 + 0x10 + lVar41);
  auVar61 = *(undefined1 (*) [16])(lVar7 + uVar44 * 4);
  uVar35 = (ulong)*(uint *)(uVar49 + 0x20 + lVar41);
  auVar66 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
  auVar101 = *(undefined1 (*) [16])(lVar7 + uVar46 * 4);
  uVar37 = (ulong)*(uint *)(uVar49 + 0x14 + lVar41);
  auVar75 = *(undefined1 (*) [16])(lVar7 + uVar37 * 4);
  uVar42 = (ulong)*(uint *)(uVar49 + 0x24 + lVar41);
  auVar67 = *(undefined1 (*) [16])(lVar7 + uVar42 * 4);
  uVar43 = (ulong)*(uint *)(uVar49 + 8 + lVar41);
  auVar76 = *(undefined1 (*) [16])(lVar7 + uVar43 * 4);
  local_1460 = (ulong)*(uint *)(uVar49 + 0x18 + lVar41);
  auVar102 = *(undefined1 (*) [16])(lVar7 + local_1460 * 4);
  uVar47 = (ulong)*(uint *)(uVar49 + 0x28 + lVar41);
  auVar53 = *(undefined1 (*) [16])(lVar7 + uVar47 * 4);
  uVar45 = (ulong)*(uint *)(uVar49 + 0xc + lVar41);
  auVar54 = *(undefined1 (*) [16])(lVar7 + uVar45 * 4);
  uVar48 = (ulong)*(uint *)(uVar49 + 0x1c + lVar41);
  auVar55 = *(undefined1 (*) [16])(lVar7 + uVar48 * 4);
  uVar39 = (ulong)*(uint *)(uVar49 + 0x2c + lVar41);
  auVar56 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
  auVar62 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar49 + lVar41) * 4);
  auVar63 = *(undefined1 (*) [16])(lVar38 + uVar44 * 4);
  fVar52 = fVar52 - auVar64._0_4_;
  auVar64 = vunpcklps_avx(auVar91,auVar76);
  auVar76 = vunpckhps_avx(auVar91,auVar76);
  auVar65 = vunpcklps_avx(auVar101,auVar54);
  auVar101 = vunpckhps_avx(auVar101,auVar54);
  auVar91 = *(undefined1 (*) [16])(lVar38 + uVar46 * 4);
  _local_13d8 = vunpcklps_avx(auVar76,auVar101);
  auVar33 = _local_13d8;
  auVar54 = vunpcklps_avx(auVar64,auVar65);
  auVar76 = vunpckhps_avx(auVar64,auVar65);
  auVar64 = vunpcklps_avx(auVar61,auVar102);
  auVar101 = vunpckhps_avx(auVar61,auVar102);
  auVar102 = vunpcklps_avx(auVar75,auVar55);
  auVar75 = vunpckhps_avx(auVar75,auVar55);
  auVar61 = *(undefined1 (*) [16])(lVar38 + uVar43 * 4);
  auVar55 = vunpcklps_avx(auVar101,auVar75);
  auVar65 = vunpcklps_avx(auVar64,auVar102);
  _local_13e8 = vunpckhps_avx(auVar64,auVar102);
  auVar32 = _local_13e8;
  auVar64 = vunpcklps_avx(auVar66,auVar53);
  auVar75 = vunpckhps_avx(auVar66,auVar53);
  auVar53 = vunpcklps_avx(auVar67,auVar56);
  auVar102 = vunpckhps_avx(auVar67,auVar56);
  auVar101 = *(undefined1 (*) [16])(lVar38 + uVar45 * 4);
  auVar56 = vunpcklps_avx(auVar75,auVar102);
  _local_13c8 = vunpcklps_avx(auVar64,auVar53);
  auVar34 = _local_13c8;
  _local_1488 = vunpckhps_avx(auVar64,auVar53);
  auVar31 = _local_1488;
  auVar75 = vunpcklps_avx(auVar62,auVar61);
  auVar61 = vunpckhps_avx(auVar62,auVar61);
  auVar102 = vunpcklps_avx(auVar91,auVar101);
  auVar101 = vunpckhps_avx(auVar91,auVar101);
  auVar91 = *(undefined1 (*) [16])(lVar38 + local_1460 * 4);
  auVar53 = vunpcklps_avx(auVar61,auVar101);
  auVar62 = vunpcklps_avx(auVar75,auVar102);
  auVar101 = vunpckhps_avx(auVar75,auVar102);
  auVar102 = vunpcklps_avx(auVar63,auVar91);
  auVar75 = vunpckhps_avx(auVar63,auVar91);
  auVar91 = *(undefined1 (*) [16])(lVar38 + uVar37 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar38 + uVar48 * 4);
  auVar63 = vunpcklps_avx(auVar91,auVar61);
  auVar91 = vunpckhps_avx(auVar91,auVar61);
  auVar64 = vunpcklps_avx(auVar75,auVar91);
  auVar66 = vunpcklps_avx(auVar102,auVar63);
  auVar75 = vunpckhps_avx(auVar102,auVar63);
  auVar91 = *(undefined1 (*) [16])(lVar38 + uVar35 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
  auVar63 = vunpcklps_avx(auVar91,auVar61);
  auVar102 = vunpckhps_avx(auVar91,auVar61);
  auVar91 = *(undefined1 (*) [16])(lVar38 + uVar42 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar38 + uVar39 * 4);
  auVar67 = vunpcklps_avx(auVar91,auVar61);
  auVar91 = vunpckhps_avx(auVar91,auVar61);
  auVar68 = vunpcklps_avx(auVar102,auVar91);
  auVar69 = vunpcklps_avx(auVar63,auVar67);
  auVar102 = vunpckhps_avx(auVar63,auVar67);
  auVar91 = vshufps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),0);
  auVar61 = vshufps_avx(ZEXT416((uint)(1.0 - fVar52)),ZEXT416((uint)(1.0 - fVar52)),0);
  fVar52 = auVar91._0_4_;
  fVar58 = auVar91._4_4_;
  fVar59 = auVar91._8_4_;
  fVar60 = auVar91._12_4_;
  fVar99 = auVar61._0_4_;
  fVar132 = auVar61._4_4_;
  fVar133 = auVar61._8_4_;
  fVar134 = auVar61._12_4_;
  auVar107._0_4_ = fVar99 * auVar54._0_4_ + fVar52 * auVar62._0_4_;
  auVar107._4_4_ = fVar132 * auVar54._4_4_ + fVar58 * auVar62._4_4_;
  auVar107._8_4_ = fVar133 * auVar54._8_4_ + fVar59 * auVar62._8_4_;
  auVar107._12_4_ = fVar134 * auVar54._12_4_ + fVar60 * auVar62._12_4_;
  auVar109._0_4_ = fVar99 * auVar76._0_4_ + fVar52 * auVar101._0_4_;
  auVar109._4_4_ = fVar132 * auVar76._4_4_ + fVar58 * auVar101._4_4_;
  auVar109._8_4_ = fVar133 * auVar76._8_4_ + fVar59 * auVar101._8_4_;
  auVar109._12_4_ = fVar134 * auVar76._12_4_ + fVar60 * auVar101._12_4_;
  auVar103._0_4_ = fVar99 * (float)local_13d8._0_4_ + fVar52 * auVar53._0_4_;
  auVar103._4_4_ = fVar132 * (float)local_13d8._4_4_ + fVar58 * auVar53._4_4_;
  auVar103._8_4_ = fVar133 * fStack_13d0 + fVar59 * auVar53._8_4_;
  auVar103._12_4_ = fVar134 * fStack_13cc + fVar60 * auVar53._12_4_;
  auVar62._0_4_ = fVar99 * auVar65._0_4_ + fVar52 * auVar66._0_4_;
  auVar62._4_4_ = fVar132 * auVar65._4_4_ + fVar58 * auVar66._4_4_;
  auVar62._8_4_ = fVar133 * auVar65._8_4_ + fVar59 * auVar66._8_4_;
  auVar62._12_4_ = fVar134 * auVar65._12_4_ + fVar60 * auVar66._12_4_;
  auVar77._0_4_ = fVar99 * (float)local_13e8._0_4_ + fVar52 * auVar75._0_4_;
  auVar77._4_4_ = fVar132 * (float)local_13e8._4_4_ + fVar58 * auVar75._4_4_;
  auVar77._8_4_ = fVar133 * fStack_13e0 + fVar59 * auVar75._8_4_;
  auVar77._12_4_ = fVar134 * fStack_13dc + fVar60 * auVar75._12_4_;
  puVar2 = (undefined8 *)(uVar49 + 0x30 + lVar41);
  local_13a8 = *puVar2;
  uStack_13a0 = puVar2[1];
  puVar2 = (undefined8 *)(uVar49 + 0x40 + lVar41);
  local_1508 = auVar55._0_4_;
  fStack_1504 = auVar55._4_4_;
  fStack_1500 = auVar55._8_4_;
  fStack_14fc = auVar55._12_4_;
  auVar112._0_4_ = fVar99 * local_1508 + auVar64._0_4_ * fVar52;
  auVar112._4_4_ = fVar132 * fStack_1504 + auVar64._4_4_ * fVar58;
  auVar112._8_4_ = fVar133 * fStack_1500 + auVar64._8_4_ * fVar59;
  auVar112._12_4_ = fVar134 * fStack_14fc + auVar64._12_4_ * fVar60;
  auVar127._0_4_ = fVar99 * (float)local_13c8._0_4_ + auVar69._0_4_ * fVar52;
  auVar127._4_4_ = fVar132 * (float)local_13c8._4_4_ + auVar69._4_4_ * fVar58;
  auVar127._8_4_ = fVar133 * fStack_13c0 + auVar69._8_4_ * fVar59;
  auVar127._12_4_ = fVar134 * fStack_13bc + auVar69._12_4_ * fVar60;
  auVar129._0_4_ = auVar102._0_4_ * fVar52 + fVar99 * (float)local_1488._0_4_;
  auVar129._4_4_ = auVar102._4_4_ * fVar58 + fVar132 * (float)local_1488._4_4_;
  auVar129._8_4_ = auVar102._8_4_ * fVar59 + fVar133 * fStack_1480;
  auVar129._12_4_ = auVar102._12_4_ * fVar60 + fVar134 * fStack_147c;
  local_14b8._0_4_ = auVar56._0_4_;
  local_14b8._4_4_ = auVar56._4_4_;
  fStack_14b0 = auVar56._8_4_;
  fStack_14ac = auVar56._12_4_;
  auVar53._0_4_ = fVar99 * (float)local_14b8._0_4_ + auVar68._0_4_ * fVar52;
  auVar53._4_4_ = fVar132 * (float)local_14b8._4_4_ + auVar68._4_4_ * fVar58;
  auVar53._8_4_ = fVar133 * fStack_14b0 + auVar68._8_4_ * fVar59;
  auVar53._12_4_ = fVar134 * fStack_14ac + auVar68._12_4_ * fVar60;
  local_13b8 = *puVar2;
  uStack_13b0 = puVar2[1];
  auVar91 = vsubps_avx(auVar107,auVar62);
  auVar61 = vsubps_avx(auVar109,auVar77);
  auVar101 = vsubps_avx(auVar103,auVar112);
  auVar75 = vsubps_avx(auVar127,auVar107);
  auVar76 = vsubps_avx(auVar129,auVar109);
  auVar102 = vsubps_avx(auVar53,auVar103);
  fVar60 = auVar102._0_4_;
  fVar114 = auVar61._0_4_;
  auVar54._0_4_ = fVar114 * fVar60;
  fVar9 = auVar102._4_4_;
  fVar116 = auVar61._4_4_;
  auVar54._4_4_ = fVar116 * fVar9;
  fVar14 = auVar102._8_4_;
  fVar118 = auVar61._8_4_;
  auVar54._8_4_ = fVar118 * fVar14;
  fVar19 = auVar102._12_4_;
  fVar120 = auVar61._12_4_;
  auVar54._12_4_ = fVar120 * fVar19;
  fVar99 = auVar76._0_4_;
  fVar122 = auVar101._0_4_;
  auVar63._0_4_ = fVar122 * fVar99;
  fVar10 = auVar76._4_4_;
  fVar124 = auVar101._4_4_;
  auVar63._4_4_ = fVar124 * fVar10;
  fVar15 = auVar76._8_4_;
  fVar125 = auVar101._8_4_;
  auVar63._8_4_ = fVar125 * fVar15;
  fVar20 = auVar76._12_4_;
  fVar126 = auVar101._12_4_;
  auVar63._12_4_ = fVar126 * fVar20;
  local_14c8 = vsubps_avx(auVar63,auVar54);
  fVar132 = auVar75._0_4_;
  auVar64._0_4_ = fVar122 * fVar132;
  fVar11 = auVar75._4_4_;
  auVar64._4_4_ = fVar124 * fVar11;
  fVar16 = auVar75._8_4_;
  auVar64._8_4_ = fVar125 * fVar16;
  fVar21 = auVar75._12_4_;
  auVar64._12_4_ = fVar126 * fVar21;
  fVar133 = auVar91._0_4_;
  auVar78._0_4_ = fVar60 * fVar133;
  fVar12 = auVar91._4_4_;
  auVar78._4_4_ = fVar9 * fVar12;
  fVar17 = auVar91._8_4_;
  auVar78._8_4_ = fVar14 * fVar17;
  fVar22 = auVar91._12_4_;
  auVar78._12_4_ = fVar19 * fVar22;
  auVar101 = vsubps_avx(auVar78,auVar64);
  auVar79._0_4_ = fVar99 * fVar133;
  auVar79._4_4_ = fVar10 * fVar12;
  auVar79._8_4_ = fVar15 * fVar17;
  auVar79._12_4_ = fVar20 * fVar22;
  auVar92._0_4_ = fVar114 * fVar132;
  auVar92._4_4_ = fVar116 * fVar11;
  auVar92._8_4_ = fVar118 * fVar16;
  auVar92._12_4_ = fVar120 * fVar21;
  local_14d8 = vsubps_avx(auVar92,auVar79);
  uVar4 = *(undefined4 *)&(ray->org).field_0;
  auVar93._4_4_ = uVar4;
  auVar93._0_4_ = uVar4;
  auVar93._8_4_ = uVar4;
  auVar93._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar55._4_4_ = uVar4;
  auVar55._0_4_ = uVar4;
  auVar55._8_4_ = uVar4;
  auVar55._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar135._4_4_ = uVar4;
  auVar135._0_4_ = uVar4;
  auVar135._8_4_ = uVar4;
  auVar135._12_4_ = uVar4;
  fVar52 = (ray->dir).field_0.m128[1];
  local_14a8 = vsubps_avx(auVar107,auVar93);
  fVar58 = (ray->dir).field_0.m128[2];
  auVar91 = vsubps_avx(auVar109,auVar55);
  auVar96 = ZEXT1664(auVar91);
  _local_14b8 = vsubps_avx(auVar103,auVar135);
  fVar134 = local_14b8._0_4_;
  auVar104._0_4_ = fVar52 * fVar134;
  fVar13 = local_14b8._4_4_;
  auVar104._4_4_ = fVar52 * fVar13;
  fVar18 = local_14b8._8_4_;
  auVar104._8_4_ = fVar52 * fVar18;
  fVar23 = local_14b8._12_4_;
  auVar104._12_4_ = fVar52 * fVar23;
  fVar90 = auVar91._0_4_;
  auVar136._0_4_ = fVar90 * fVar58;
  fVar97 = auVar91._4_4_;
  auVar136._4_4_ = fVar97 * fVar58;
  fVar98 = auVar91._8_4_;
  auVar136._8_4_ = fVar98 * fVar58;
  fVar100 = auVar91._12_4_;
  auVar136._12_4_ = fVar100 * fVar58;
  auVar61 = vsubps_avx(auVar136,auVar104);
  fVar59 = (ray->dir).field_0.m128[0];
  fVar74 = local_14a8._0_4_;
  auVar56._0_4_ = fVar74 * fVar58;
  fVar87 = local_14a8._4_4_;
  auVar56._4_4_ = fVar87 * fVar58;
  fVar88 = local_14a8._8_4_;
  auVar56._8_4_ = fVar88 * fVar58;
  fVar89 = local_14a8._12_4_;
  auVar56._12_4_ = fVar89 * fVar58;
  auVar65._0_4_ = fVar134 * fVar59;
  auVar65._4_4_ = fVar13 * fVar59;
  auVar65._8_4_ = fVar18 * fVar59;
  auVar65._12_4_ = fVar23 * fVar59;
  auVar75 = vsubps_avx(auVar65,auVar56);
  auVar66._0_4_ = fVar90 * fVar59;
  auVar66._4_4_ = fVar97 * fVar59;
  auVar66._8_4_ = fVar98 * fVar59;
  auVar66._12_4_ = fVar100 * fVar59;
  auVar80._0_4_ = fVar52 * fVar74;
  auVar80._4_4_ = fVar52 * fVar87;
  auVar80._8_4_ = fVar52 * fVar88;
  auVar80._12_4_ = fVar52 * fVar89;
  auVar76 = vsubps_avx(auVar80,auVar66);
  auVar102 = local_14d8;
  auVar81._0_4_ = local_14c8._0_4_ * fVar59 + fVar52 * auVar101._0_4_ + local_14d8._0_4_ * fVar58;
  auVar81._4_4_ = local_14c8._4_4_ * fVar59 + fVar52 * auVar101._4_4_ + local_14d8._4_4_ * fVar58;
  auVar81._8_4_ = local_14c8._8_4_ * fVar59 + fVar52 * auVar101._8_4_ + local_14d8._8_4_ * fVar58;
  auVar81._12_4_ =
       local_14c8._12_4_ * fVar59 + fVar52 * auVar101._12_4_ + local_14d8._12_4_ * fVar58;
  auVar86 = ZEXT1664(auVar81);
  auVar67._8_8_ = 0x8000000080000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar91 = vandps_avx(auVar81,auVar67);
  uVar36 = auVar91._0_4_;
  local_1398._0_4_ =
       (float)(uVar36 ^ (uint)(fVar132 * auVar61._0_4_ +
                              fVar99 * auVar75._0_4_ + fVar60 * auVar76._0_4_));
  uVar117 = auVar91._4_4_;
  local_1398._4_4_ =
       (float)(uVar117 ^
              (uint)(fVar11 * auVar61._4_4_ + fVar10 * auVar75._4_4_ + fVar9 * auVar76._4_4_));
  uVar119 = auVar91._8_4_;
  local_1398._8_4_ =
       (float)(uVar119 ^
              (uint)(fVar16 * auVar61._8_4_ + fVar15 * auVar75._8_4_ + fVar14 * auVar76._8_4_));
  uVar121 = auVar91._12_4_;
  local_1398._12_4_ =
       (float)(uVar121 ^
              (uint)(fVar21 * auVar61._12_4_ + fVar20 * auVar75._12_4_ + fVar19 * auVar76._12_4_));
  auVar106 = ZEXT1664(local_1398);
  local_1388._0_4_ =
       (float)(uVar36 ^ (uint)(auVar61._0_4_ * fVar133 +
                              fVar114 * auVar75._0_4_ + fVar122 * auVar76._0_4_));
  local_1388._4_4_ =
       (float)(uVar117 ^
              (uint)(auVar61._4_4_ * fVar12 + fVar116 * auVar75._4_4_ + fVar124 * auVar76._4_4_));
  local_1388._8_4_ =
       (float)(uVar119 ^
              (uint)(auVar61._8_4_ * fVar17 + fVar118 * auVar75._8_4_ + fVar125 * auVar76._8_4_));
  local_1388._12_4_ =
       (float)(uVar121 ^
              (uint)(auVar61._12_4_ * fVar22 + fVar120 * auVar75._12_4_ + fVar126 * auVar76._12_4_))
  ;
  auVar75 = ZEXT816(0) << 0x20;
  auVar91 = vcmpps_avx(local_1398,auVar75,5);
  auVar61 = vcmpps_avx(local_1388,auVar75,5);
  auVar91 = vandps_avx(auVar91,auVar61);
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  local_1368 = vandps_avx(auVar81,auVar68);
  auVar61 = vcmpps_avx(auVar75,auVar81,4);
  auVar91 = vandps_avx(auVar91,auVar61);
  auVar69._0_4_ = local_1398._0_4_ + local_1388._0_4_;
  auVar69._4_4_ = local_1398._4_4_ + local_1388._4_4_;
  auVar69._8_4_ = local_1398._8_4_ + local_1388._8_4_;
  auVar69._12_4_ = local_1398._12_4_ + local_1388._12_4_;
  auVar61 = vcmpps_avx(auVar69,local_1368,2);
  auVar73 = ZEXT1664(auVar61);
  auVar91 = vandps_avx(auVar91,auVar61);
  auVar61._8_8_ = uStack_13f0;
  auVar61._0_8_ = local_13f8;
  auVar61 = auVar61 & auVar91;
  if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar61[0xf] < '\0') {
    auVar30._8_8_ = uStack_13f0;
    auVar30._0_8_ = local_13f8;
    auVar91 = vandps_avx(auVar91,auVar30);
    local_1378._0_4_ =
         (float)(uVar36 ^ (uint)(local_14c8._0_4_ * fVar74 +
                                fVar90 * auVar101._0_4_ + fVar134 * local_14d8._0_4_));
    local_1378._4_4_ =
         (float)(uVar117 ^
                (uint)(local_14c8._4_4_ * fVar87 +
                      fVar97 * auVar101._4_4_ + fVar13 * local_14d8._4_4_));
    local_1378._8_4_ =
         (float)(uVar119 ^
                (uint)(local_14c8._8_4_ * fVar88 +
                      fVar98 * auVar101._8_4_ + fVar18 * local_14d8._8_4_));
    local_1378._12_4_ =
         (float)(uVar121 ^
                (uint)(local_14c8._12_4_ * fVar89 +
                      fVar100 * auVar101._12_4_ + fVar23 * local_14d8._12_4_));
    auVar96 = ZEXT1664(local_1378);
    fVar52 = (ray->org).field_0.m128[3];
    fVar58 = local_1368._0_4_;
    auVar70._0_4_ = fVar58 * fVar52;
    fVar59 = local_1368._4_4_;
    auVar70._4_4_ = fVar59 * fVar52;
    fVar60 = local_1368._8_4_;
    auVar70._8_4_ = fVar60 * fVar52;
    fVar99 = local_1368._12_4_;
    auVar70._12_4_ = fVar99 * fVar52;
    auVar61 = vcmpps_avx(auVar70,local_1378,1);
    fVar52 = ray->tfar;
    auVar82._0_4_ = fVar58 * fVar52;
    auVar82._4_4_ = fVar59 * fVar52;
    auVar82._8_4_ = fVar60 * fVar52;
    auVar82._12_4_ = fVar99 * fVar52;
    auVar75 = vcmpps_avx(local_1378,auVar82,2);
    auVar86 = ZEXT1664(auVar75);
    auVar61 = vandps_avx(auVar75,auVar61);
    auVar73 = ZEXT1664(auVar61);
    local_1348 = vandps_avx(auVar61,auVar91);
    uVar36 = vmovmskps_avx(local_1348);
    if (uVar36 != 0) {
      local_1308 = local_14c8;
      local_1518 = auVar101._0_8_;
      uStack_1510 = auVar101._8_8_;
      local_12f8 = local_1518;
      uStack_12f0 = uStack_1510;
      local_12e8 = local_14d8._0_8_;
      uStack_12e0 = local_14d8._8_8_;
      auVar91 = vrcpps_avx(local_1368);
      fVar52 = auVar91._0_4_;
      auVar71._0_4_ = fVar58 * fVar52;
      fVar58 = auVar91._4_4_;
      auVar71._4_4_ = fVar59 * fVar58;
      fVar59 = auVar91._8_4_;
      auVar71._8_4_ = fVar60 * fVar59;
      fVar60 = auVar91._12_4_;
      auVar71._12_4_ = fVar99 * fVar60;
      auVar83._8_4_ = 0x3f800000;
      auVar83._0_8_ = 0x3f8000003f800000;
      auVar83._12_4_ = 0x3f800000;
      auVar86 = ZEXT1664(auVar83);
      auVar91 = vsubps_avx(auVar83,auVar71);
      fVar52 = fVar52 + fVar52 * auVar91._0_4_;
      fVar58 = fVar58 + fVar58 * auVar91._4_4_;
      fVar59 = fVar59 + fVar59 * auVar91._8_4_;
      fVar60 = fVar60 + fVar60 * auVar91._12_4_;
      local_1318[0] = fVar52 * local_1378._0_4_;
      local_1318[1] = fVar58 * local_1378._4_4_;
      local_1318[2] = fVar59 * local_1378._8_4_;
      local_1318[3] = fVar60 * local_1378._12_4_;
      local_1338._0_4_ = fVar52 * local_1398._0_4_;
      local_1338._4_4_ = fVar58 * local_1398._4_4_;
      local_1338._8_4_ = fVar59 * local_1398._8_4_;
      local_1338._12_4_ = fVar60 * local_1398._12_4_;
      auVar73 = ZEXT1664(local_1338);
      local_1328._0_4_ = fVar52 * local_1388._0_4_;
      local_1328._4_4_ = fVar58 * local_1388._4_4_;
      local_1328._8_4_ = fVar59 * local_1388._8_4_;
      local_1328._12_4_ = fVar60 * local_1388._12_4_;
      uVar39 = (ulong)(uVar36 & 0xff);
      local_14d8 = auVar102;
      _local_1488 = auVar31;
      _local_13e8 = auVar32;
      _local_13d8 = auVar33;
      _local_13c8 = auVar34;
      do {
        uVar35 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        local_1440 = *(uint *)((long)&local_13a8 + uVar35 * 4);
        pGVar6 = (local_1478->geometries).items[local_1440].ptr;
        if ((pGVar6->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e5f454;
          local_14c8._0_8_ = context->args;
          local_1428.context = context->user;
          local_1458 = *(uint *)(local_1308 + uVar35 * 4);
          auVar91 = ZEXT416(local_1458);
          local_1454 = *(uint *)((long)&local_12f8 + uVar35 * 4);
          auVar61 = ZEXT416(local_1454);
          local_1450 = *(uint *)((long)&local_12e8 + uVar35 * 4);
          auVar101 = ZEXT416(local_1450);
          local_144c = *(undefined4 *)(local_1338 + uVar35 * 4);
          local_1448 = local_1318[uVar35 - 4];
          local_1444 = *(undefined4 *)((long)&local_13b8 + uVar35 * 4);
          local_143c = (local_1428.context)->instID[0];
          local_1438 = (local_1428.context)->instPrimID[0];
          local_14a8._0_4_ = ray->tfar;
          local_14d8._0_8_ = uVar35;
          ray->tfar = local_1318[uVar35];
          local_14dc = -1;
          local_1428.valid = &local_14dc;
          local_1428.geometryUserPtr = pGVar6->userPtr;
          local_1428.hit = (RTCHitN *)&local_1458;
          local_1428.N = 1;
          local_1428.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e5f3d4:
            if ((*(code **)(local_14c8._0_8_ + 0x10) == (code *)0x0) ||
               (((*(byte *)local_14c8._0_8_ & 2) == 0 && (((pGVar6->field_8).field_0x2 & 0x40) == 0)
                ))) {
LAB_00e5f454:
              ray->tfar = -INFINITY;
              return;
            }
            auVar86 = ZEXT1664(auVar91);
            auVar96 = ZEXT1664(auVar61);
            auVar106 = ZEXT1664(auVar101);
            (**(code **)(local_14c8._0_8_ + 0x10))(&local_1428);
            auVar73._8_56_ = extraout_var_00;
            auVar73._0_8_ = extraout_XMM1_Qa_00;
            if (*local_1428.valid != 0) goto LAB_00e5f454;
          }
          else {
            auVar86 = ZEXT464(local_1458);
            auVar96 = ZEXT464(local_1454);
            auVar106 = ZEXT464(local_1450);
            (*pGVar6->occlusionFilterN)(&local_1428);
            auVar101 = auVar106._0_16_;
            auVar61 = auVar96._0_16_;
            auVar91 = auVar86._0_16_;
            auVar73._8_56_ = extraout_var;
            auVar73._0_8_ = extraout_XMM1_Qa;
            if (*local_1428.valid != 0) goto LAB_00e5f3d4;
          }
          ray->tfar = (float)local_14a8._0_4_;
          uVar35 = local_14d8._0_8_;
        }
        uVar39 = uVar39 ^ 1L << (uVar35 & 0x3f);
      } while (uVar39 != 0);
    }
  }
  local_1490 = local_1490 + 1;
  auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar110 = ZEXT3264(local_11f8);
  auVar111 = ZEXT3264(local_1218);
  auVar113 = ZEXT3264(local_1238);
  auVar115 = ZEXT3264(local_1258);
  auVar123 = ZEXT3264(local_1278);
  auVar128 = ZEXT3264(local_1298);
  auVar130 = ZEXT3264(local_12b8);
  auVar131 = ZEXT3264(local_12d8);
  uVar39 = local_1470;
  goto LAB_00e5ec2e;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }